

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gen.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
rc::Gen<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::operator*
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Gen<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  ValueType pGVar1;
  ValueType *ppGVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  _func_Any_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr **in_RCX;
  pointer *__ptr;
  Any local_a8;
  undefined1 local_a0 [48];
  Gen<rc::detail::Any> local_70;
  Gen<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_48;
  
  ppGVar2 = rc::detail::ImplicitParam<rc::gen::detail::param::CurrentHandler>::value();
  pGVar1 = *ppGVar2;
  Gen(&local_48,this);
  local_a0._0_8_ = rc::detail::Any::of<std::__cxx11::string>;
  rc::gen::map<std::__cxx11::string,rc::detail::Any(*)(std::__cxx11::string&&)>
            ((Gen<rc::detail::Any> *)(local_a0 + 8),(gen *)&local_48,
             (Gen<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_a0,in_RCX);
  Gen<rc::detail::Any>::as(&local_70,(Gen<rc::detail::Any> *)(local_a0 + 8),&this->m_name);
  (**pGVar1->_vptr_GenerationHandler)(&local_a8,pGVar1,&local_70);
  pbVar3 = rc::detail::Any::get<std::__cxx11::string>(&local_a8);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar3);
  if (local_a8.m_impl._M_t.
      super___uniq_ptr_impl<rc::detail::Any::IAnyImpl,_std::default_delete<rc::detail::Any::IAnyImpl>_>
      ._M_t.
      super__Tuple_impl<0UL,_rc::detail::Any::IAnyImpl_*,_std::default_delete<rc::detail::Any::IAnyImpl>_>
      .super__Head_base<0UL,_rc::detail::Any::IAnyImpl_*,_false>._M_head_impl !=
      (__uniq_ptr_data<rc::detail::Any::IAnyImpl,_std::default_delete<rc::detail::Any::IAnyImpl>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_a8.m_impl._M_t.
        super___uniq_ptr_impl<rc::detail::Any::IAnyImpl,_std::default_delete<rc::detail::Any::IAnyImpl>_>
        ._M_t.
        super__Tuple_impl<0UL,_rc::detail::Any::IAnyImpl_*,_std::default_delete<rc::detail::Any::IAnyImpl>_>
        .super__Head_base<0UL,_rc::detail::Any::IAnyImpl_*,_false>._M_head_impl)[5])();
  }
  local_a8.m_impl._M_t.
  super___uniq_ptr_impl<rc::detail::Any::IAnyImpl,_std::default_delete<rc::detail::Any::IAnyImpl>_>.
  _M_t.
  super__Tuple_impl<0UL,_rc::detail::Any::IAnyImpl_*,_std::default_delete<rc::detail::Any::IAnyImpl>_>
  .super__Head_base<0UL,_rc::detail::Any::IAnyImpl_*,_false>._M_head_impl =
       (unique_ptr<rc::detail::Any::IAnyImpl,_std::default_delete<rc::detail::Any::IAnyImpl>_>)
       (__uniq_ptr_data<rc::detail::Any::IAnyImpl,_std::default_delete<rc::detail::Any::IAnyImpl>,_true,_true>
        )0x0;
  Gen<rc::detail::Any>::~Gen(&local_70);
  Gen<rc::detail::Any>::~Gen((Gen<rc::detail::Any> *)(local_a0 + 8));
  ~Gen(&local_48);
  return __return_storage_ptr__;
}

Assistant:

T Gen<T>::operator*() const {
  using namespace detail;
  using rc::gen::detail::param::CurrentHandler;
  const auto handler = ImplicitParam<CurrentHandler>::value();
  return std::move(handler->onGenerate(gen::map(*this, &Any::of<T>).as(m_name))
                       .template get<T>());
}